

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address_is_readable.cc
# Opt level: O1

bool absl::lts_20240722::debugging_internal::AddressIsReadable(void *addr)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  if (((ulong)addr & 0xfffffffffffffff8) == 0) {
    return false;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  lVar4 = syscall(0xe,0xffffffff,(ulong)addr & 0xfffffffffffffff8,0,8);
  if (lVar4 == -1) {
    iVar2 = *piVar3;
    if ((iVar2 == 0xe) || (iVar2 == 0x16)) {
      *piVar3 = iVar1;
      return iVar2 != 0xe;
    }
  }
  else {
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"address_is_readable.cc",0x59,"Check %s failed: %s",
               "syscall(SYS_rt_sigprocmask, ~0, addr, nullptr, 8) == -1","unexpected success");
    AddressIsReadable();
  }
  absl::lts_20240722::raw_log_internal::RawLog
            (kFatal,"address_is_readable.cc",0x5a,"Check %s failed: %s",
             "errno == EFAULT || errno == EINVAL","unexpected errno");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/debugging/internal/address_is_readable.cc"
                ,0x5a,"bool absl::debugging_internal::AddressIsReadable(const void *)");
}

Assistant:

bool AddressIsReadable(const void *addr) {
  // rt_sigprocmask below checks 8 contiguous bytes. If addr resides in the
  // last 7 bytes of a page (unaligned), rt_sigprocmask would additionally
  // check the readability of the next page, which is not desired. Align
  // address on 8-byte boundary to check only the current page.
  const uintptr_t u_addr = reinterpret_cast<uintptr_t>(addr) & ~uintptr_t{7};
  addr = reinterpret_cast<const void *>(u_addr);

  // rt_sigprocmask below will succeed for this input.
  if (addr == nullptr) return false;

  absl::base_internal::ErrnoSaver errno_saver;

  // Here we probe with some syscall which
  // - accepts an 8-byte region of user memory as input
  // - tests for EFAULT before other validation
  // - has no problematic side-effects
  //
  // rt_sigprocmask(2) works for this.  It copies sizeof(kernel_sigset_t)==8
  // bytes from the address into the kernel memory before any validation.
  //
  // The call can never succeed, since the `how` parameter is not one of
  // SIG_BLOCK, SIG_UNBLOCK, SIG_SETMASK.
  //
  // This strategy depends on Linux implementation details,
  // so we rely on the test to alert us if it stops working.
  //
  // Some discarded past approaches:
  // - msync() doesn't reject PROT_NONE regions
  // - write() on /dev/null doesn't return EFAULT
  // - write() on a pipe requires creating it and draining the writes
  // - connect() works but is problematic for sandboxes and needs a valid
  //   file descriptor
  //
  // This can never succeed (invalid first argument to sigprocmask).
  ABSL_RAW_CHECK(syscall(SYS_rt_sigprocmask, ~0, addr, nullptr,
                         /*sizeof(kernel_sigset_t)*/ 8) == -1,
                 "unexpected success");
  ABSL_RAW_CHECK(errno == EFAULT || errno == EINVAL, "unexpected errno");
  return errno != EFAULT;
}